

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsCreateWeakReference(JsValueRef value,JsWeakRef *weakRef)

{
  anon_class_16_2_de6f0a53 fn;
  bool bVar1;
  JsWeakRef *local_20;
  JsWeakRef *weakRef_local;
  JsValueRef value_local;
  
  if (value == (JsValueRef)0x0) {
    value_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (weakRef == (JsWeakRef *)0x0) {
    value_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *weakRef = (JsWeakRef)0x0;
    local_20 = weakRef;
    weakRef_local = (JsWeakRef *)value;
    bVar1 = Js::TaggedNumber::Is(value);
    if (bVar1) {
      value_local._4_4_ = JsNoWeakRefRequired;
    }
    else {
      fn.weakRef = &local_20;
      fn.value = &weakRef_local;
      value_local._4_4_ = GlobalAPIWrapper_NoRecord<JsCreateWeakReference::__0>(fn);
    }
  }
  return value_local._4_4_;
}

Assistant:

CHAKRA_API JsCreateWeakReference(
    _In_ JsValueRef value,
    _Out_ JsWeakRef* weakRef)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(weakRef);
    *weakRef = nullptr;

    if (Js::TaggedNumber::Is(value))
    {
        return JsNoWeakRefRequired;
    }

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }

        Recycler* recycler = threadContext->GetRecycler();
        if (recycler->IsInObjectBeforeCollectCallback())
        {
            return JsErrorInObjectBeforeCollectCallback;
        }

        RecyclerHeapObjectInfo dummyObjectInfo;
        if (!recycler->FindHeapObject(value, Memory::FindHeapObjectFlags::FindHeapObjectFlags_NoFlags, dummyObjectInfo))
        {
            // value is not recyler-allocated
            return JsErrorInvalidArgument;
        }

        recycler->FindOrCreateWeakReferenceHandle<char>(
            reinterpret_cast<char*>(value),
            reinterpret_cast<Memory::RecyclerWeakReference<char>**>(weakRef));
        return JsNoError;
    });
}